

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADAFWInstanceBase.h
# Opt level: O2

void __thiscall
COLLADAFW::InstanceBase<(COLLADAFW::COLLADA_TYPE::ClassId)521>::~InstanceBase
          (InstanceBase<(COLLADAFW::COLLADA_TYPE::ClassId)521> *this)

{
  (this->super_ObjectTemplate<(COLLADAFW::COLLADA_TYPE::ClassId)521>).super_Object._vptr_Object =
       (_func_int **)&PTR__InstanceBase_0095e2d8;
  UniqueId::~UniqueId(&this->mInstanciatedObjectId);
  std::__cxx11::string::~string((string *)&this->mName);
  ObjectTemplate<(COLLADAFW::COLLADA_TYPE::ClassId)521>::~ObjectTemplate
            (&this->super_ObjectTemplate<(COLLADAFW::COLLADA_TYPE::ClassId)521>);
  return;
}

Assistant:

virtual ~InstanceBase() {}